

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void outputVector<double>
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *vector,string *filename)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int local_22c;
  int local_228;
  int j;
  int i;
  string local_218 [8];
  ofstream stream;
  string *filename_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *vector_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,(_Ios_Openmode)filename);
  local_228 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(vector);
    if (sVar1 <= (ulong)(long)local_228) break;
    local_22c = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](vector,(long)local_228);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_22c) break;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](vector,(long)local_228);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_22c);
      std::ostream::operator<<((ostream *)local_218,*pvVar3);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](vector,(long)local_228);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if ((long)local_22c != sVar1 - 1) {
        std::operator<<((ostream *)local_218,',');
      }
      local_22c = local_22c + 1;
    }
    std::ostream::operator<<((ostream *)local_218,std::endl<char,std::char_traits<char>>);
    local_228 = local_228 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void outputVector(const std::vector<std::vector<T> > &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);

    for(int i=0;i<vector.size();i++){
        for(int j=0;j<vector[i].size();j++){
            stream<<vector[i][j];
            if(j!=(vector[i].size()-1)){
                stream<<',';
            }
        }
        stream<<std::endl;
    }
    stream.close();
}